

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  istream *piVar1;
  bool bVar2;
  double value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  Value local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  String buffer;
  IStringStream is;
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,token->start_,token->end_);
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&buffer,_S_in);
  piVar1 = std::istream::_M_extract<double>((double *)&is);
  bVar2 = ((&piVar1->field_0x20)[(long)piVar1->_vptr_basic_istream[-3]] & 5) != 0;
  if (bVar2) {
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,token->start_,token->end_);
    std::operator+(&local_1e0,"\'",&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208,
                   &local_1e0,"\' is not a number.");
    addError(this,(String *)&local_208,token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_228);
  }
  else {
    Value::Value(&local_208,0.0);
    Value::operator=(decoded,&local_208);
    Value::~Value(&local_208);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::~string((string *)&buffer);
  return !bVar2;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  String buffer(token.start_, token.end_);
  IStringStream is(buffer);
  if (!(is >> value)) {
    if (value == std::numeric_limits<double>::max())
      value = std::numeric_limits<double>::infinity();
    else if (value == std::numeric_limits<double>::lowest())
      value = -std::numeric_limits<double>::infinity();
    else if (!std::isinf(value))
      return addError(
        "'" + String(token.start_, token.end_) + "' is not a number.", token);
  }
  decoded = value;
  return true;
}